

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall t_netstd_generator::generate_enum(t_netstd_generator *this,t_enum *tenum)

{
  int iVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  _func_int **pp_Var5;
  long *plVar6;
  uint uVar7;
  ostream *out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string f_enum_name;
  ofstream_with_content_based_conditional_update f_enum;
  allocator local_211;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  undefined1 local_1d0 [16];
  _func_int *local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  iVar1 = (this->super_t_oop_generator).super_t_generator.indent_;
  pcVar2 = (this->namespace_dir_)._M_dataplus._M_p;
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_210,pcVar2,pcVar2 + (this->namespace_dir_)._M_string_length);
  std::__cxx11::string::append((char *)local_210);
  iVar3 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_210,*(ulong *)CONCAT44(extraout_var,iVar3));
  pp_Var5 = (_func_int **)(plVar4 + 2);
  if ((_func_int **)*plVar4 == pp_Var5) {
    local_1c0 = *pp_Var5;
    lStack_1b8 = plVar4[3];
    local_1d0._0_8_ = &local_1c0;
  }
  else {
    local_1c0 = *pp_Var5;
    local_1d0._0_8_ = (_func_int **)*plVar4;
  }
  local_1d0._8_8_ = plVar4[1];
  *plVar4 = (long)pp_Var5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_1d0);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_1e0 = *plVar6;
    lStack_1d8 = plVar4[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar6;
    local_1f0 = (long *)*plVar4;
  }
  local_1e8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((_func_int **)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if (local_210[0] != local_200) {
    operator_delete(local_210[0]);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string((string *)local_210,(char *)local_1f0,&local_211);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  if (local_210[0] != local_200) {
    operator_delete(local_210[0]);
  }
  out = (ostream *)local_1d0;
  generate_enum(this,out,tenum);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,(int)out);
  uVar7 = iVar1 - (this->super_t_oop_generator).super_t_generator.indent_;
  if (uVar7 != 0) {
    pverbose("Wrong indent count in %s: difference = %i \n","generate_enum",(ulong)uVar7);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_enum(t_enum* tenum)
{
    int ic = indent_count();
    string f_enum_name = namespace_dir_ + "/" + tenum->get_name() + ".cs";

    ofstream_with_content_based_conditional_update f_enum;
    f_enum.open(f_enum_name.c_str());

    generate_enum(f_enum, tenum);

    f_enum.close();
    indent_validate(ic, "generate_enum");
}